

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<char> * __thiscall
cimg_library::CImgList<char>::insert(CImgList<char> *this,uint n,uint pos)

{
  bool bVar1;
  CImg<char> empty;
  CImg<char> local_48;
  
  local_48._data = (char *)0x0;
  local_48._width = 0;
  local_48._height = 0;
  local_48._depth = 0;
  local_48._spectrum = 0;
  local_48._is_shared = false;
  if (n != 0) {
    if (pos == 0xffffffff) {
      pos = this->_width;
    }
    while (bVar1 = n != 0, n = n - 1, bVar1) {
      insert(this,&local_48,pos,false);
      pos = pos + 1;
    }
  }
  CImg<char>::~CImg(&local_48);
  return this;
}

Assistant:

CImgList<T>& insert(const unsigned int n, const unsigned int pos=~0U) {
      CImg<T> empty;
      if (!n) return *this;
      const unsigned int npos = pos==~0U?_width:pos;
      for (unsigned int i = 0; i<n; ++i) insert(empty,npos+i);
      return *this;
    }